

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void not_equal_to_suite::compare_null_with_boolean(void)

{
  bool bVar1;
  basic_variable<std::allocator<char>_> local_e8;
  basic_variable<std::allocator<char>_> local_b8;
  not_equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_> local_85 [13];
  basic_variable<std::allocator<char>_> local_78;
  basic_variable<std::allocator<char>_> local_48;
  not_equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_> local_9;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_78,false);
  bVar1 = std::not_equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator()
                    (&local_9,&local_48,&local_78);
  boost::detail::test_impl
            ("std::not_equal_to<variable>()(variable(), false)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x21a6,"void not_equal_to_suite::compare_null_with_boolean()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_e8,false);
  bVar1 = std::not_equal_to<trial::dynamic::basic_variable<std::allocator<char>_>_>::operator()
                    (local_85,&local_b8,&local_e8);
  boost::detail::test_impl
            ("std::not_equal_to<variable>()(variable(), variable(false))",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x21a7,"void not_equal_to_suite::compare_null_with_boolean()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b8);
  return;
}

Assistant:

void compare_null_with_boolean()
{
    TRIAL_PROTOCOL_TEST(std::not_equal_to<variable>()(variable(), false));
    TRIAL_PROTOCOL_TEST(std::not_equal_to<variable>()(variable(), variable(false)));
}